

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamReaderPrivate::raiseNamePrefixTooLongError(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  QXmlStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  Error in_stack_ffffffffffffffb4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStream::tr((char *)in_RDI,
                 (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
  raiseError(in_RDI,in_stack_ffffffffffffffb4,
             (QString *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  QString::~QString((QString *)0x649c14);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::raiseNamePrefixTooLongError()
{
    // TODO: add a ImplementationLimitsExceededError and use it instead
    raiseError(QXmlStreamReader::NotWellFormedError,
               QXmlStream::tr("Length of XML attribute name exceeds implementation limits (4KiB "
                              "characters)."));
}